

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void sexp_bignum_split(sexp ctx,sexp a,sexp_uint_t k,sexp_conflict *lo,sexp_conflict *hi)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  sexp_uint_t sVar4;
  sexp psVar5;
  long *in_RCX;
  ulong in_RDX;
  sexp in_RSI;
  long *in_R8;
  sexp_uint_t *hidata;
  sexp_uint_t *lodata;
  sexp_uint_t *adata;
  sexp_uint_t i;
  sexp_uint_t alen;
  sexp_uint_t in_stack_ffffffffffffffb8;
  sexp ctx_00;
  ulong local_38;
  
  sVar4 = sexp_bignum_hi(in_RSI);
  ctx_00 = (sexp)((long)&in_RSI->value + 0x10);
  psVar5 = sexp_make_bignum(ctx_00,in_stack_ffffffffffffffb8);
  *in_RCX = (long)psVar5;
  psVar5 = sexp_make_bignum(ctx_00,in_stack_ffffffffffffffb8);
  *in_R8 = (long)psVar5;
  lVar1 = *in_RCX;
  lVar2 = *in_R8;
  for (local_38 = 0; uVar3 = in_RDX, local_38 < in_RDX; local_38 = local_38 + 1) {
    *(undefined8 *)(lVar1 + 0x18 + local_38 * 8) = *(undefined8 *)(&ctx_00->tag + local_38 * 2);
  }
  while (local_38 = uVar3, local_38 < sVar4) {
    *(undefined8 *)(lVar2 + 0x18 + (local_38 - in_RDX) * 8) =
         *(undefined8 *)(&ctx_00->tag + local_38 * 2);
    uVar3 = local_38 + 1;
  }
  return;
}

Assistant:

static void sexp_bignum_split (sexp ctx, sexp a, sexp_uint_t k, sexp* lo, sexp* hi) {
  sexp_uint_t alen=sexp_bignum_hi(a), i, *adata=sexp_bignum_data(a),
    *lodata, *hidata;
  *lo = sexp_make_bignum(ctx, k);        /* must be gc protected by caller */
  *hi = sexp_make_bignum(ctx, alen-k+1);
  lodata = sexp_bignum_data(*lo);
  hidata = sexp_bignum_data(*hi);
  for (i=0; i<k; i++)                    /* split into a[0..k-1], a[k..] */
    lodata[i] = adata[i];
  for (i=k; i<alen; i++)
    hidata[i-k] = adata[i];
}